

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RuntimeThreadData.cpp
# Opt level: O2

DWORD __thiscall RuntimeThreadData::ThreadProc(RuntimeThreadData *this)

{
  code *pcVar1;
  bool bVar2;
  JsErrorCode jsErrorCode;
  DWORD DVar3;
  PAL_FILE *pPVar4;
  LPCWSTR pWVar5;
  DWORD_PTR DVar6;
  char16_t *format;
  long in_FS_OFFSET;
  JsValueRef local_70;
  JsValueRef fname;
  HANDLE pVStack_60;
  JsValueRef local_58;
  JsValueRef args [3];
  JsValueRef local_38;
  JsValueRef scriptSource;
  
  *(RuntimeThreadData **)(in_FS_OFFSET + -0x18) = this;
  jsErrorCode = (*ChakraRTInterface::m_jsApiHooks.pfJsrtCreateRuntime)
                          (JsRuntimeAttributeNone,(JsThreadServiceCallback)0x0,&this->runtime);
  if (jsErrorCode == JsNoError) {
    jsErrorCode = (*ChakraRTInterface::m_jsApiHooks.pfJsrtCreateContext)
                            (this->runtime,&this->context);
    if (jsErrorCode == JsNoError) {
      jsErrorCode = (*ChakraRTInterface::m_jsApiHooks.pfJsrtSetCurrentContext)(this->context);
      if (jsErrorCode == JsNoError) {
        bVar2 = WScriptJsrt::Initialize();
        if (!bVar2) goto LAB_00114571;
        jsErrorCode = (*ChakraRTInterface::m_jsApiHooks.pfJsrtCreateExternalArrayBuffer)
                                ((this->initialSource)._M_dataplus._M_p,
                                 (uint)(this->initialSource)._M_string_length,
                                 (JsFinalizeCallback)0x0,(void *)0x0,&local_38);
        if (jsErrorCode == JsNoError) {
          (*ChakraRTInterface::m_jsApiHooks.pfJsrtCreateString)("agent source",0xc,&local_70);
          DVar6 = WScriptJsrt::GetNextSourceContext();
          (*ChakraRTInterface::m_jsApiHooks.pfJsrtRun)
                    (local_38,DVar6,local_70,JsParseScriptAttributeNone,(JsValueRef *)0x0);
          SetEvent(this->parent->hevntInitialScriptCompleted);
          do {
            fname = this->hevntReceivedBroadcast;
            pVStack_60 = this->hevntShutdown;
            DVar3 = WaitForMultipleObjects(2,&fname,0,0xffffffff);
            if (DVar3 != 0) {
              if ((DVar3 != 1) && (this->leaving == false)) {
                pPVar4 = PAL_get_stderr(0);
                PAL_fprintf(pPVar4,"ASSERTION (%s, line %d) %s %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/bin/ch/RuntimeThreadData.cpp"
                            ,0x76,"false","false");
                pPVar4 = PAL_get_stderr(0);
                PAL_fflush(pPVar4);
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
              break;
            }
            (*ChakraRTInterface::m_jsApiHooks.pfJsrtGetGlobalObject)(&local_58);
            (*ChakraRTInterface::m_jsApiHooks.pfJsrtCreateSharedArrayBufferWithSharedContent)
                      (this->parent->sharedContent,args);
            (*ChakraRTInterface::m_jsApiHooks.pfJsrtDoubleToNumber)(1.0,args + 1);
            ReleaseSemaphore(this->parent->hSemaphore,1,(LPLONG)0x0);
            if (this->receiveBroadcastCallbackFunc != (JsValueRef)0x0) {
              (*ChakraRTInterface::m_jsApiHooks.pfJsrtCallFunction)
                        (this->receiveBroadcastCallbackFunc,&local_58,3,(JsValueRef *)0x0);
            }
          } while (this->leaving != true);
          WScriptJsrt::Uninitialize();
          if (this->receiveBroadcastCallbackFunc != (JsRef)0x0) {
            (*ChakraRTInterface::m_jsApiHooks.pfJsrtRelease)
                      (this->receiveBroadcastCallbackFunc,(uint *)0x0);
          }
          goto LAB_00114571;
        }
        pPVar4 = PAL_get_stderr(0);
        pWVar5 = Helpers::JsErrorCodeToString(jsErrorCode);
        format = 
        L"ERROR: ChakraRTInterface::JsCreateExternalArrayBuffer((void*)this->initialSource.c_str(), (unsigned int)this->initialSource.size(), nullptr, nullptr, &scriptSource) failed. JsErrorCode=0x%x (%s)\n"
        ;
      }
      else {
        pPVar4 = PAL_get_stderr(0);
        pWVar5 = Helpers::JsErrorCodeToString(jsErrorCode);
        format = 
        L"ERROR: ChakraRTInterface::JsSetCurrentContext(context) failed. JsErrorCode=0x%x (%s)\n";
      }
    }
    else {
      pPVar4 = PAL_get_stderr(0);
      pWVar5 = Helpers::JsErrorCodeToString(jsErrorCode);
      format = 
      L"ERROR: ChakraRTInterface::JsCreateContext(runtime, &context) failed. JsErrorCode=0x%x (%s)\n"
      ;
    }
  }
  else {
    pPVar4 = PAL_get_stderr(0);
    pWVar5 = Helpers::JsErrorCodeToString(jsErrorCode);
    format = 
    L"ERROR: ChakraRTInterface::JsCreateRuntime(JsRuntimeAttributeNone, nullptr, &runtime) failed. JsErrorCode=0x%x (%s)\n"
    ;
  }
  PAL_fwprintf(pPVar4,format,(ulong)jsErrorCode,pWVar5);
  pPVar4 = PAL_get_stderr(0);
  PAL_fflush(pPVar4);
LAB_00114571:
  (*ChakraRTInterface::m_jsApiHooks.pfJsrtSetCurrentContext)((JsContextRef)0x0);
  (*ChakraRTInterface::m_jsApiHooks.pfJsrtDisposeRuntime)(this->runtime);
  return 0;
}

Assistant:

DWORD RuntimeThreadData::ThreadProc()
{
    JsValueRef scriptSource;
    JsValueRef fname;
    const char* fullPath = "agent source";
    HRESULT hr = S_OK;

    threadLocalData.Initialize(this);

    IfJsErrorFailLog(ChakraRTInterface::JsCreateRuntime(JsRuntimeAttributeNone, nullptr, &runtime));
    IfJsErrorFailLog(ChakraRTInterface::JsCreateContext(runtime, &context));
    IfJsErrorFailLog(ChakraRTInterface::JsSetCurrentContext(context));


    if (!WScriptJsrt::Initialize())
    {
        IfFailGo(E_FAIL);
    }


    IfJsErrorFailLog(ChakraRTInterface::JsCreateExternalArrayBuffer((void*)this->initialSource.c_str(),
        (unsigned int)this->initialSource.size(), nullptr, nullptr, &scriptSource));


    ChakraRTInterface::JsCreateString(fullPath, strlen(fullPath), &fname);

    ChakraRTInterface::JsRun(scriptSource, WScriptJsrt::GetNextSourceContext(), fname, JsParseScriptAttributeNone, nullptr);

    SetEvent(this->parent->hevntInitialScriptCompleted);

    // loop waiting for work;

    while (true)
    {
        HANDLE handles[] = { this->hevntReceivedBroadcast, this->hevntShutdown };
        DWORD waitRet = WaitForMultipleObjects(_countof(handles), handles, false, INFINITE);

        if (waitRet == WAIT_OBJECT_0)
        {
            JsValueRef args[3];
            ChakraRTInterface::JsGetGlobalObject(&args[0]);
            ChakraRTInterface::JsCreateSharedArrayBufferWithSharedContent(this->parent->sharedContent, &args[1]);
            ChakraRTInterface::JsDoubleToNumber(1, &args[2]);

            // notify the parent we received the data
            ReleaseSemaphore(this->parent->hSemaphore, 1, NULL);

            if (this->receiveBroadcastCallbackFunc)
            {
                ChakraRTInterface::JsCallFunction(this->receiveBroadcastCallbackFunc, args, 3, nullptr);
            }
        }

        if (waitRet == WAIT_OBJECT_0 + 1 || this->leaving)
        {
            WScriptJsrt::Uninitialize();

            if (this->receiveBroadcastCallbackFunc)
            {
                ChakraRTInterface::JsRelease(this->receiveBroadcastCallbackFunc, nullptr);
            }
            ChakraRTInterface::JsSetCurrentContext(nullptr);
            ChakraRTInterface::JsDisposeRuntime(runtime);

            threadLocalData.Uninitialize();
            return 0;
        }
        else if (waitRet != WAIT_OBJECT_0)
        {
            Assert(false);
            break;
        }
    }

Error:

    ChakraRTInterface::JsSetCurrentContext(nullptr);
    ChakraRTInterface::JsDisposeRuntime(runtime);
    threadLocalData.Uninitialize();
    return 0;
}